

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qnativesocketengine_p.cpp
# Opt level: O0

void QNativeSocketEngine::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int in_EDX;
  int in_ESI;
  QNativeSocketEngine *in_RDI;
  QNativeSocketEngine *_t;
  
  if ((in_ESI == 0) && (in_EDX == 0)) {
    connectionNotification(in_RDI);
  }
  return;
}

Assistant:

void QNativeSocketEngine::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QNativeSocketEngine *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->connectionNotification(); break;
        default: ;
        }
    }
    (void)_a;
}